

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_event_listener.cpp
# Opt level: O2

void HawkTracer::parser::print_event(Event *event,size_t indent)

{
  ostream *poVar1;
  __node_base *p_Var2;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50 [32];
  
  p_Var2 = &(event->_values)._M_h._M_before_begin;
LAB_001102f0:
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      return;
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)indent);
    std::operator<<((ostream *)&std::cout,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::string((string *)local_70,(string *)(p_Var2[6]._M_nxt + 4));
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_70);
    poVar1 = std::operator<<(poVar1,' ');
    std::__cxx11::string::string(local_50,(string *)p_Var2[6]._M_nxt);
    poVar1 = std::operator<<(poVar1,local_50);
    std::operator<<(poVar1,": ");
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)local_70);
    switch(*(undefined4 *)&p_Var2[6]._M_nxt[10]._M_nxt) {
    case 0:
    case 1:
      poVar1 = std::operator<<((ostream *)&std::cout,*(char *)&p_Var2[5]._M_nxt);
      break;
    case 2:
      poVar1 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(ushort *)&p_Var2[5]._M_nxt);
      break;
    case 3:
      poVar1 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(short *)&p_Var2[5]._M_nxt);
      break;
    case 4:
      goto LAB_0011040b;
    case 5:
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var2[5]._M_nxt);
      break;
    case 6:
LAB_0011040b:
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      break;
    case 7:
      poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
      break;
    case 8:
      poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
      break;
    case 9:
      poVar1 = std::operator<<((ostream *)&std::cout,(char *)p_Var2[5]._M_nxt);
      break;
    case 10:
      goto switchD_001103a5_caseD_a;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/debug_event_listener.cpp"
                    ,0x1b,"void HawkTracer::parser::print_field_value(const Event::Value &)");
    }
    std::endl<char,std::char_traits<char>>(poVar1);
  } while( true );
switchD_001103a5_caseD_a:
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  print_event((Event *)p_Var2[5]._M_nxt,indent + 2);
  goto LAB_001102f0;
}

Assistant:

static void print_event(const Event& event, size_t indent)
{
    for (const auto& value : event.get_values())
    {
        std::cout << std::string(indent, ' ');
        std::cout << value.second.field->get_type_name() << ' ' << value.second.field->get_name() << ": ";
        
        if (value.second.field->get_type_id() == FieldTypeId::STRUCT)
        {
            std::cout << std::endl;
            print_event(*value.second.value.f_EVENT, indent + 2);
        }
        else
        {
            print_field_value(value.second);
        }
    }
}